

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O0

double __thiscall libDAI::TRW::run(TRW *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  uint uVar9;
  ostream *poVar10;
  void *pvVar11;
  mapped_type *pmVar12;
  ulong uVar13;
  pointer ppVar14;
  long *in_RDI;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double y3;
  double x3;
  double y2;
  double x2;
  double y1;
  double x1;
  const_iterator pos_1;
  const_iterator pos;
  const_iterator last;
  const_iterator nan;
  const_iterator best;
  double gain;
  bool ready;
  map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
  alpha_gain;
  WeightedGraph<double> cur_rho;
  double weight;
  size_t iter;
  double alpha;
  double cur_logZ;
  double prev_logZ;
  ostream *in_stack_fffffffffffffbd8;
  WeightedGraph<double> *in_stack_fffffffffffffbe0;
  ostream *in_stack_fffffffffffffbe8;
  TRW *in_stack_fffffffffffffc00;
  ostream *in_stack_fffffffffffffc18;
  TRW *in_stack_fffffffffffffc20;
  char *local_2d0;
  iterator local_1a0;
  _Rb_tree_const_iterator<std::pair<const_double,_double>_> local_198;
  iterator local_190;
  _Rb_tree_const_iterator<std::pair<const_double,_double>_> local_188;
  _Base_ptr local_180;
  iterator local_178;
  _Rb_tree_const_iterator<std::pair<const_double,_double>_> local_170;
  iterator local_168;
  _Rb_tree_const_iterator<std::pair<const_double,_double>_> local_160;
  _Base_ptr local_158;
  iterator in_stack_fffffffffffffeb0;
  _Rb_tree_const_iterator<std::pair<const_double,_double>_> local_148;
  iterator local_140;
  _Rb_tree_const_iterator<std::pair<const_double,_double>_> local_138;
  iterator local_130;
  _Rb_tree_const_iterator<std::pair<const_double,_double>_> local_128;
  iterator local_120;
  _Rb_tree_const_iterator<std::pair<const_double,_double>_> local_118;
  iterator local_110;
  _Rb_tree_const_iterator<std::pair<const_double,_double>_> local_108;
  iterator local_100;
  _Rb_tree_const_iterator<std::pair<const_double,_double>_> local_f8;
  double local_f0;
  undefined1 local_e8 [16];
  byte local_d1;
  double local_70;
  ulong local_68;
  double local_60;
  TRW *local_58;
  undefined1 local_50 [16];
  TRW *local_40;
  string local_28 [40];
  
  if (in_RDI[0x28] != 0) {
    poVar10 = std::operator<<((ostream *)&std::cout,"Starting ");
    (**(code **)(*in_RDI + 0x48))();
    poVar10 = std::operator<<(poVar10,local_28);
    poVar10 = std::operator<<(poVar10,"...");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_28);
  }
  (**(code **)(*in_RDI + 0x70))();
  inner_loop(in_stack_fffffffffffffc00);
  local_50 = (**(code **)(*in_RDI + 0x68))();
  local_58 = (TRW *)std::real<double>((complex<double> *)0xba4f69);
  local_60 = 0.5;
  local_68 = 0;
  local_40 = local_58;
  do {
    if ((ulong)in_RDI[0x27] <= local_68) {
LAB_00ba62de:
      auVar23._8_8_ = 0x7fffffffffffffff;
      auVar23._0_8_ = 0x7fffffffffffffff;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = (double)local_58 - (double)local_40;
      auVar28 = vpand_avx(auVar17,auVar23);
      return auVar28._0_8_;
    }
    local_70 = calc_rho_descent((TRW *)in_stack_fffffffffffffeb0._M_node);
    if (1 < (ulong)in_RDI[0x28]) {
      poVar10 = (ostream *)
                std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<(poVar10,"iter = ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_68);
      poVar10 = std::operator<<(poVar10,", cur_logZ = ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(double)local_58);
      poVar10 = std::operator<<(poVar10,", weight = ");
      pvVar11 = (void *)std::ostream::operator<<(poVar10,local_70);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    }
    uVar9 = std::isnan(local_70);
    if ((uVar9 & 1) != 0) {
      if (in_RDI[0x28] != 0) {
        poVar10 = (ostream *)
                  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        poVar10 = std::operator<<(poVar10,
                                  "Reached NAN! Not going further...you\'ll have to use the current result"
                                 );
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      goto LAB_00ba62de;
    }
    WeightedGraph<double>::WeightedGraph
              (in_stack_fffffffffffffbe0,(WeightedGraph<double> *)in_stack_fffffffffffffbd8);
    std::map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>::
    map((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_> *
        )0xba50f0);
    local_d1 = 0;
    do {
      WeightedGraph<double>::operator=
                (in_stack_fffffffffffffbe0,(WeightedGraph<double> *)in_stack_fffffffffffffbd8);
      if (2 < (ulong)in_RDI[0x28]) {
        poVar10 = std::operator<<((ostream *)&std::cout,"checking alpha = ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_60);
        poVar10 = std::operator<<(poVar10,"...");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      update_rho_e(in_stack_fffffffffffffc20,(double)in_stack_fffffffffffffc18);
      inner_loop(in_stack_fffffffffffffc00);
      auVar28 = (**(code **)(*in_RDI + 0x68))();
      local_e8 = auVar28;
      local_58 = (TRW *)std::real<double>((complex<double> *)0xba524f);
      local_f0 = (double)local_40 - (double)local_58;
      if (2 < (ulong)in_RDI[0x28]) {
        poVar10 = std::operator<<((ostream *)&std::cout,"  for alpha = ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_60);
        poVar10 = std::operator<<(poVar10,", gain = ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_f0);
        poVar10 = std::operator<<(poVar10," >=? alpha * weight = ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_60 * local_70);
        poVar10 = std::operator<<(poVar10,", gain / (alpha * weight) = ");
        pvVar11 = (void *)std::ostream::operator<<(poVar10,local_f0 / (local_60 * local_70));
        std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
      }
      dVar1 = local_f0;
      if ((local_d1 & 1) != 0) break;
      pmVar12 = std::
                map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                ::operator[]((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                              *)in_stack_fffffffffffffc20,
                             (key_type_conflict1 *)in_stack_fffffffffffffc18);
      *pmVar12 = dVar1;
      local_100._M_node =
           (_Base_ptr)
           std::
           map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
           ::begin((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                    *)in_stack_fffffffffffffbd8);
      std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::_Rb_tree_const_iterator
                (&local_f8,&local_100);
      local_110._M_node =
           (_Base_ptr)
           std::
           map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
           ::end((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                  *)in_stack_fffffffffffffbd8);
      std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::_Rb_tree_const_iterator
                (&local_108,&local_110);
      local_120._M_node =
           (_Base_ptr)
           std::
           map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
           ::begin((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                    *)in_stack_fffffffffffffbd8);
      std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::_Rb_tree_const_iterator
                (&local_118,&local_120);
      local_130._M_node =
           (_Base_ptr)
           std::
           map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
           ::begin((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                    *)in_stack_fffffffffffffbd8);
      std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::_Rb_tree_const_iterator
                (&local_128,&local_130);
      while( true ) {
        local_140._M_node =
             (_Base_ptr)
             std::
             map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
             ::end((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                    *)in_stack_fffffffffffffbd8);
        std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::_Rb_tree_const_iterator
                  (&local_138,&local_140);
        bVar8 = std::operator!=(&local_128,&local_138);
        if (!bVar8) break;
        ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                            ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)0xba5525);
        uVar9 = std::isnan(ppVar14->second);
        if ((uVar9 & 1) == 0) {
          local_118._M_node = local_128._M_node;
          ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                              ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)0xba55b9
                              );
          dVar1 = ppVar14->second;
          ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                              ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)0xba55d4
                              );
          if (ppVar14->second < dVar1) {
            local_f8._M_node = local_128._M_node;
          }
        }
        else {
          in_stack_fffffffffffffeb0 =
               std::
               map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
               ::end((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                      *)in_stack_fffffffffffffbd8);
          std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::_Rb_tree_const_iterator
                    (&local_148,(iterator *)&stack0xfffffffffffffeb0);
          bVar8 = std::operator==(&local_108,&local_148);
          if (bVar8) {
            local_108._M_node = local_128._M_node;
          }
        }
        local_158 = (_Base_ptr)
                    std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator++
                              ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)
                               in_stack_fffffffffffffbe8,
                               (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
      }
      uVar13 = (**(code **)(*in_RDI + 0x30))();
      if (2 < uVar13) {
        local_168._M_node =
             (_Base_ptr)
             std::
             map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
             ::begin((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                      *)in_stack_fffffffffffffbd8);
        std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::_Rb_tree_const_iterator
                  (&local_160,&local_168);
        while( true ) {
          local_178._M_node =
               (_Base_ptr)
               std::
               map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
               ::end((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                      *)in_stack_fffffffffffffbd8);
          std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::_Rb_tree_const_iterator
                    (&local_170,&local_178);
          bVar8 = std::operator!=(&local_160,&local_170);
          if (!bVar8) break;
          poVar10 = std::operator<<((ostream *)&std::cout,"      ");
          bVar8 = std::operator==(&local_160,&local_f8);
          if (bVar8) {
            local_2d0 = "*";
          }
          else {
            local_2d0 = " ";
          }
          poVar10 = std::operator<<(poVar10,local_2d0);
          ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                              ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)0xba5739
                              );
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,ppVar14->first);
          poVar10 = std::operator<<(poVar10," ");
          ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                              ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)0xba577f
                              );
          pvVar11 = (void *)std::ostream::operator<<(poVar10,ppVar14->second);
          std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
          local_180 = (_Base_ptr)
                      std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator++
                                ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)
                                 in_stack_fffffffffffffbe8,
                                 (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
        }
      }
      local_190._M_node =
           (_Base_ptr)
           std::
           map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
           ::begin((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                    *)in_stack_fffffffffffffbd8);
      std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::_Rb_tree_const_iterator
                (&local_188,&local_190);
      bVar8 = std::operator==(&local_f8,&local_188);
      if (bVar8) {
        ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                            ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)0xba5823);
        local_60 = ppVar14->first / 2.0;
      }
      else {
        bVar8 = std::operator==(&local_f8,&local_118);
        if (bVar8) {
          local_1a0._M_node =
               (_Base_ptr)
               std::
               map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
               ::end((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                      *)in_stack_fffffffffffffbd8);
          std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::_Rb_tree_const_iterator
                    (&local_198,&local_1a0);
          bVar8 = std::operator==(&local_108,&local_198);
          if (bVar8) {
            ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                                ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)
                                 0xba58b1);
            dVar1 = ppVar14->first + 1.0;
          }
          else {
            ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                                ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)
                                 0xba58e1);
            dVar1 = ppVar14->first;
            ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                                ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)
                                 0xba58fb);
            dVar1 = dVar1 + ppVar14->first;
          }
          local_60 = dVar1 / 2.0;
        }
        else {
          std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator--
                    ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)
                     in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
          ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                              ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)0xba5946
                              );
          dVar1 = ppVar14->first;
          ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                              ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)0xba5960
                              );
          dVar2 = ppVar14->second;
          std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator++
                    ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)
                     in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
          ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                              ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)0xba5992
                              );
          dVar3 = ppVar14->first;
          ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                              ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)0xba59ac
                              );
          dVar4 = ppVar14->second;
          std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator++
                    ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)
                     in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
          ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                              ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)0xba59de
                              );
          dVar5 = ppVar14->first;
          ppVar14 = std::_Rb_tree_const_iterator<std::pair<const_double,_double>_>::operator->
                              ((_Rb_tree_const_iterator<std::pair<const_double,_double>_> *)0xba59f8
                              );
          dVar6 = ppVar14->second;
          dVar7 = dVar3;
          if ((((double)in_RDI[0x24] <= dVar5 - dVar1) && (dVar4 < dVar2)) && (dVar4 < dVar6)) {
            if (2 < (ulong)in_RDI[0x28]) {
              std::operator<<((ostream *)&std::cout,"  fitting parabola through ");
              std::ios_base::precision
                        ((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0xf);
              poVar10 = std::operator<<((ostream *)&std::cout,"(x1,y1) = (");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar1);
              poVar10 = std::operator<<(poVar10,",");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar2);
              std::operator<<(poVar10,"), ");
              poVar10 = std::operator<<((ostream *)&std::cout,"(x2,y2) = (");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar3);
              poVar10 = std::operator<<(poVar10,",");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar4);
              std::operator<<(poVar10,"), ");
              poVar10 = std::operator<<((ostream *)&std::cout,"(x3,y3) = (");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar5);
              poVar10 = std::operator<<(poVar10,",");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar6);
              poVar10 = std::operator<<(poVar10,").");
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            }
            auVar28._8_8_ = 0;
            auVar28._0_8_ = dVar1 * dVar1;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = dVar3 * dVar3 * (dVar2 - dVar6);
            auVar24._8_8_ = 0;
            auVar24._0_8_ = dVar6 - dVar4;
            auVar28 = vfmadd213sd_fma(auVar24,auVar28,auVar18);
            auVar15._8_8_ = 0;
            auVar15._0_8_ = dVar5 * dVar5;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = dVar4 - dVar2;
            auVar28 = vfmadd213sd_fma(auVar19,auVar15,auVar28);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = dVar1;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = dVar3 * (dVar2 - dVar6);
            auVar27._8_8_ = 0;
            auVar27._0_8_ = dVar6 - dVar4;
            auVar15 = vfmadd213sd_fma(auVar27,auVar20,auVar25);
            auVar26._8_8_ = 0;
            auVar26._0_8_ = dVar5;
            auVar21._8_8_ = 0;
            auVar21._0_8_ = dVar4 - dVar2;
            auVar15 = vfmadd213sd_fma(auVar21,auVar26,auVar15);
            dVar7 = (auVar28._0_8_ * 0.5) / auVar15._0_8_;
          }
          local_60 = dVar7;
          if (dVar5 < local_60) {
            std::ios_base::precision
                      ((ios_base *)((long)&std::cerr + *(long *)(std::cerr + -0x18)),0xf);
            poVar10 = std::operator<<((ostream *)&std::cerr,"alpha = ");
            pvVar11 = (void *)std::ostream::operator<<(poVar10,local_60);
            std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
            poVar10 = std::operator<<((ostream *)&std::cerr,"(x1,y1) = (");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar1);
            poVar10 = std::operator<<(poVar10,",");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar2);
            std::operator<<(poVar10,"), ");
            poVar10 = std::operator<<((ostream *)&std::cerr,"(x2,y2) = (");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar3);
            poVar10 = std::operator<<(poVar10,",");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar4);
            std::operator<<(poVar10,"), ");
            poVar10 = std::operator<<((ostream *)&std::cerr,"(x3,y3) = (");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar5);
            poVar10 = std::operator<<(poVar10,",");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar6);
            poVar10 = std::operator<<(poVar10,").");
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            if (((dVar5 - dVar1 < (double)in_RDI[0x24]) || (dVar2 <= dVar4)) || (dVar6 <= dVar4)) {
              in_stack_fffffffffffffc20 =
                   (TRW *)std::operator<<((ostream *)&std::cerr,"used alpha = x2");
              std::ostream::operator<<
                        (in_stack_fffffffffffffc20,std::endl<char,std::char_traits<char>>);
            }
            else {
              in_stack_fffffffffffffc18 = std::operator<<((ostream *)&std::cerr,"fitted parabola");
              std::ostream::operator<<
                        (in_stack_fffffffffffffc18,std::endl<char,std::char_traits<char>>);
            }
          }
          local_d1 = 1;
        }
      }
      if (local_60 < (double)in_RDI[0x24]) {
        local_60 = 0.0;
        WeightedGraph<double>::operator=
                  (in_stack_fffffffffffffbe0,(WeightedGraph<double> *)in_stack_fffffffffffffbd8);
        inner_loop(in_stack_fffffffffffffc00);
        (**(code **)(*in_RDI + 0x68))();
        in_stack_fffffffffffffc00 = (TRW *)std::real<double>((complex<double> *)0xba6126);
        local_58 = in_stack_fffffffffffffc00;
      }
    } while ((double)in_RDI[0x24] < local_60);
    if (2 < (ulong)in_RDI[0x28]) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Accepted alpha = ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_60);
      in_stack_fffffffffffffbe8 = std::operator<<(poVar10,", this gives improvement of logZ of ");
      in_stack_fffffffffffffbe0 =
           (WeightedGraph<double> *)
           std::ostream::operator<<(in_stack_fffffffffffffbe8,(double)local_40 - (double)local_58);
      std::ostream::operator<<(in_stack_fffffffffffffbe0,std::endl<char,std::char_traits<char>>);
    }
    auVar22._8_8_ = 0x7fffffffffffffff;
    auVar22._0_8_ = 0x7fffffffffffffff;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (double)local_58 - (double)local_40;
    auVar28 = vpand_avx(auVar16,auVar22);
    if ((double)in_RDI[0x25] <= auVar28._0_8_) {
      local_40 = local_58;
      bVar8 = false;
    }
    else {
      if (in_RDI[0x28] != 0) {
        in_stack_fffffffffffffbd8 =
             std::operator<<((ostream *)&std::cout,"Reached tolerance! Ready!");
        std::ostream::operator<<(in_stack_fffffffffffffbd8,std::endl<char,std::char_traits<char>>);
      }
      bVar8 = true;
    }
    std::map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>::
    ~map((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
          *)0xba62a7);
    WeightedGraph<double>::~WeightedGraph((WeightedGraph<double> *)0xba62b4);
    if (bVar8) goto LAB_00ba62de;
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

double TRW::run() {
        if( Props.verbose >= 1 )
            cout << "Starting " << identify() << "..." << endl;

        init();

        inner_loop();

        double prev_logZ = real(logZ());
        double cur_logZ = prev_logZ;
        double alpha = 0.5;
        for( size_t iter = 0; iter < Props.maxouteriter; iter++ ) {
            double weight = calc_rho_descent();
            // weight = - <nabla f, \tilde rho_e_descent>

            if( Props.verbose >= 2 )
                cout << endl << "iter = " << iter << ", cur_logZ = " << cur_logZ << ", weight = " << weight << endl;
            if( std::isnan( weight ) ) {
                if( Props.verbose >= 1 )
                    cout << endl << "Reached NAN! Not going further...you'll have to use the current result" << endl;
                break;  // don't proceed, as this will lead to even more nan's
            }

            WeightedGraph<double> cur_rho = _rho_e;
            map<double,double> alpha_gain;
            bool ready = false;
            do {
                _rho_e = cur_rho;
                if( Props.verbose >= 3 )
                    cout << "checking alpha = " << alpha << "..." << endl;
                update_rho_e(alpha); // rho_e = (1-alpha) cur_rho + alpha rho_descent

                // calculate everything at rho_e
                inner_loop();

                cur_logZ = real(logZ());
                double gain = prev_logZ - cur_logZ;  // should be positive
                if( Props.verbose >= 3 )
                    cout << "  for alpha = " << alpha << ", gain = " << gain << " >=? alpha * weight = " << alpha * weight << ", gain / (alpha * weight) = " << gain / (alpha * weight) << endl;

                if( ready )
                    break;

                alpha_gain[alpha] = gain;

                map<double,double>::const_iterator best = alpha_gain.begin();       // alpha with highest gain
                map<double,double>::const_iterator nan = alpha_gain.end();          // lowest alpha with gain==NAN
                map<double,double>::const_iterator last = alpha_gain.begin();       // highest alpha with gain!=NAN
                for( map<double,double>::const_iterator pos = alpha_gain.begin(); pos != alpha_gain.end(); pos++ ) {
                    if( std::isnan(pos->second) ) {
                        if( nan == alpha_gain.end() )
                            nan = pos;
                    } else {
                        last = pos;
                        if( pos->second > best->second )
                            best = pos;
                    }
                }
                if( Verbose() >= 3 )
                    for( map<double,double>::const_iterator pos = alpha_gain.begin(); pos != alpha_gain.end(); pos++ )
                        cout << "      " << ((pos == best) ? "*" : " ") << pos->first << " " << pos->second << endl;
                if( best == alpha_gain.begin() )
                    alpha = best->first / 2.0;
                else if( best == last ) {
                    if( nan == alpha_gain.end() )
                        alpha = (1.0 + best->first) / 2.0;
                    else
                        alpha = (nan->first + best->first) / 2.0;
                } else {
                    // fit a parabola through three points around best
                    best--; double x1 = best->first; double y1 = best->second;
                    best++; double x2 = best->first; double y2 = best->second;
                    best++; double x3 = best->first; double y3 = best->second;
                    assert( y1 <= y2 );
                    assert( y3 <= y2 );
                    if( (x3 - x1) < Props.tol || !((y2 < y1) && (y2 < y3)) )
                        alpha = x2;
                    else { // this is unstable if (x3-x1) becomes too small...
                        if( Props.verbose >= 3 ) {
                            cout << "  fitting parabola through ";
                            cout.precision( 15 );
                            cout << "(x1,y1) = (" << x1 << "," << y1 << "), ";
                            cout << "(x2,y2) = (" << x2 << "," << y2 << "), ";
                            cout << "(x3,y3) = (" << x3 << "," << y3 << ")." << endl;
                        }
                        alpha = 0.5 * (x1*x1*(y3-y2) + x2*x2*(y1-y3) + x3*x3*(y2-y1)) / (x1*(y3-y2) + x2*(y1-y3) + x3*(y2-y1));
                    }
                    assert( 0.0 < alpha );
                    assert( alpha < 1.0 );
                    assert( x1 <= alpha );
                    if( !(alpha <= x3) ) {
                        cerr.precision( 15 );
                        cerr << "alpha = " << alpha << endl;
                        cerr << "(x1,y1) = (" << x1 << "," << y1 << "), ";
                        cerr << "(x2,y2) = (" << x2 << "," << y2 << "), ";
                        cerr << "(x3,y3) = (" << x3 << "," << y3 << ")." << endl;
                        if( (x3 - x1) < Props.tol || !((y2 < y1) && (y2 < y3)) )
                            cerr << "used alpha = x2" << endl;
                        else
                            cerr << "fitted parabola" << endl;
                    }
                    assert( alpha <= x3 );
                    ready = true;
                }
                if( alpha < Props.tol ) {
                    alpha = 0.0;    // stay where you are in this case
                    _rho_e = cur_rho;
                    // calculate everything at rho_e
                    inner_loop();
                    cur_logZ = real(logZ());
                }
            } while( alpha > Props.tol ); 
            assert( !std::isnan(cur_logZ) );
            if( Props.verbose >= 3 ) {
                cout << "Accepted alpha = " << alpha << ", this gives improvement of logZ of " << prev_logZ - cur_logZ << endl;
            }

            if( fabs( cur_logZ - prev_logZ ) < Props.outertol )  {
                if( Props.verbose >= 1 )
                    cout << "Reached tolerance! Ready!" << endl;
                break; // reached tolerance
            }
            prev_logZ = cur_logZ;
        }

        assert( !std::isnan( cur_logZ ) );
        assert( !std::isnan( prev_logZ ) );
        return( fabs( cur_logZ - prev_logZ ) );
    }